

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::UnpackSnorm4x8Case::UnpackSnorm4x8Case
          (UnpackSnorm4x8Case *this,Context *context,ShaderType shaderType)

{
  allocator<char> local_89;
  VarType local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Symbol local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"unpacksnorm4x8",(allocator<char> *)&local_88);
  std::operator+(&local_50.name,&local_70,
                 *(char **)(getShaderTypePostfix(glu::ShaderType)::s_postfix + (ulong)shaderType * 8
                           ));
  ShaderPackingFunctionCase::ShaderPackingFunctionCase
            (&this->super_ShaderPackingFunctionCase,context,local_50.name._M_dataplus._M_p,
             "unpackSnorm4x8",shaderType);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderPackingFunctionCase_01e4c8b0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"in0",&local_89);
  glu::VarType::VarType(&local_88,TYPE_UINT,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_50,&local_70,&local_88);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_ShaderPackingFunctionCase).m_spec.inputs,&local_50);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_50);
  glu::VarType::~VarType(&local_88);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out0",&local_89);
  glu::VarType::VarType(&local_88,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_50,&local_70,&local_88);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_ShaderPackingFunctionCase).m_spec.outputs,&local_50);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_50);
  glu::VarType::~VarType(&local_88);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::assign((char *)&(this->super_ShaderPackingFunctionCase).m_spec.source);
  return;
}

Assistant:

UnpackSnorm4x8Case (Context& context, glu::ShaderType shaderType)
		: ShaderPackingFunctionCase(context, (string("unpacksnorm4x8") + getShaderTypePostfix(shaderType)).c_str(), "unpackSnorm4x8", shaderType)
	{
		m_spec.inputs.push_back(Symbol("in0", glu::VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP)));

		m_spec.source = "out0 = unpackSnorm4x8(in0);";
	}